

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O3

int SetChunk(char *fourcc,int chunk_num,WebPChunkIterator *iter)

{
  void *pvVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long *plVar6;
  uint uVar7;
  uint8_t *mem_buf;
  uint uVar8;
  
  iVar5 = 0;
  if ((((-1 < chunk_num) && (fourcc != (char *)0x0)) &&
      (pvVar1 = iter->private_, pvVar1 != (void *)0x0)) &&
     (plVar2 = *(long **)((long)pvVar1 + 0x58), iVar5 = 0, plVar2 != (long *)0x0)) {
    lVar3 = *(long *)((long)pvVar1 + 0x20);
    uVar7 = 0;
    plVar6 = plVar2;
    do {
      lVar4 = *plVar6;
      plVar6 = (long *)plVar6[2];
      uVar7 = uVar7 + (*(int *)(lVar3 + lVar4) == *(int *)fourcc);
    } while (plVar6 != (long *)0x0);
    iVar5 = 0;
    if (uVar7 != 0) {
      if (chunk_num == 0) {
        chunk_num = uVar7;
      }
      if (chunk_num <= (int)uVar7) {
        lVar4 = *plVar2;
        for (uVar8 = (uint)(*(int *)(lVar3 + lVar4) == *(int *)fourcc); chunk_num != uVar8;
            uVar8 = uVar8 + (*(int *)(lVar3 + lVar4) == *(int *)fourcc)) {
          plVar2 = (long *)plVar2[2];
          lVar4 = *plVar2;
        }
        (iter->chunk).bytes = (uint8_t *)(lVar4 + lVar3 + 8);
        (iter->chunk).size = plVar2[1] - 8;
        iter->num_chunks = uVar7;
        iter->chunk_num = chunk_num;
        iVar5 = 1;
      }
    }
  }
  return iVar5;
}

Assistant:

static int SetChunk(const char fourcc[4], int chunk_num,
                    WebPChunkIterator* const iter) {
  const WebPDemuxer* const dmux = (WebPDemuxer*)iter->private_;
  int count;

  if (dmux == NULL || fourcc == NULL || chunk_num < 0) return 0;
  count = ChunkCount(dmux, fourcc);
  if (count == 0) return 0;
  if (chunk_num == 0) chunk_num = count;

  if (chunk_num <= count) {
    const uint8_t* const mem_buf = dmux->mem_.buf_;
    const Chunk* const chunk = GetChunk(dmux, fourcc, chunk_num);
    iter->chunk.bytes = mem_buf + chunk->data_.offset_ + CHUNK_HEADER_SIZE;
    iter->chunk.size  = chunk->data_.size_ - CHUNK_HEADER_SIZE;
    iter->num_chunks  = count;
    iter->chunk_num   = chunk_num;
    return 1;
  }
  return 0;
}